

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * Matrix3f::rotateY(Matrix3f *__return_storage_ptr__,float radians)

{
  double dVar1;
  double dVar2;
  float s;
  float c;
  float radians_local;
  
  dVar1 = cos((double)radians);
  dVar2 = sin((double)radians);
  Matrix3f(__return_storage_ptr__,(float)dVar1,0.0,(float)dVar2,0.0,1.0,0.0,-(float)dVar2,0.0,
           (float)dVar1);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotateY( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix3f
	(
		c, 0, s,
		0, 1, 0,
		-s, 0, c
	);
}